

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::output_example(vw *all,cb_explore *data,example *ec,label *ld)

{
  v_array<char> *pvVar1;
  int iVar2;
  shared_data *this;
  int *piVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  bool bVar6;
  cb_class *pcVar7;
  action_score *paVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  wclass *pwVar13;
  uint uVar14;
  int *piVar15;
  float fVar16;
  undefined4 uVar17;
  float fVar18;
  char temp_str [20];
  stringstream ss;
  stringstream sso;
  undefined8 in_stack_fffffffffffffc68;
  undefined1 *local_378;
  undefined1 local_368 [16];
  char local_358 [24];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pcVar7 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar7;
  fVar18 = 0.0;
  if (pcVar7 != (cb_class *)0x0) {
    paVar8 = (ec->pred).a_s._begin;
    lVar10 = (long)(ec->pred).scalars._end - (long)paVar8;
    if (lVar10 != 0) {
      uVar11 = 0;
      do {
        uVar12 = (int)uVar11 + 1;
        for (pwVar13 = (data->cbcs).pred_scores.costs._begin;
            pwVar13 != (data->cbcs).pred_scores.costs._end; pwVar13 = pwVar13 + 1) {
          if (pwVar13->class_index == uVar12) {
            fVar16 = 0.0;
            if (pcVar7->action == uVar12) {
              fVar16 = (pcVar7->cost - pwVar13->x) / pcVar7->probability;
            }
            fVar16 = pwVar13->x + fVar16;
            goto LAB_0022772b;
          }
        }
        fVar16 = 0.0;
        if (pcVar7->action == uVar12) {
          fVar16 = pcVar7->cost / pcVar7->probability;
        }
LAB_0022772b:
        fVar18 = fVar18 + fVar16 * paVar8[uVar11].score;
        uVar11 = (ulong)uVar12;
      } while (uVar11 < (ulong)(lVar10 >> 3));
    }
  }
  this = all->sd;
  bVar6 = ec->test_only;
  pcVar7 = GEN_CS::get_observed_cost(ld);
  shared_data::update(this,bVar6,pcVar7 != (cb_class *)0x0,fVar18,1.0,ec->num_features);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar8 = (ec->pred).a_s._begin;
  if ((action_score *)(ec->pred).scalars._end == paVar8) {
    uVar12 = 0;
    uVar17 = 0;
  }
  else {
    fVar18 = 0.0;
    uVar11 = 0;
    uVar14 = 1;
    uVar12 = 0;
    do {
      sprintf(local_358,"%f ",SUB84((double)paVar8[uVar11].score,0));
      sVar9 = strlen(local_358);
      fVar16 = fVar18;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,local_358,sVar9);
      paVar8 = (ec->pred).a_s._begin;
      fVar18 = paVar8[uVar11].score;
      if (fVar16 < fVar18) {
        uVar12 = uVar14;
      }
      if (fVar18 <= fVar16) {
        fVar18 = fVar16;
      }
      uVar11 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar11 < (ulong)((long)(ec->pred).scalars._end - (long)paVar8 >> 3));
    uVar17 = SUB84((double)fVar18,0);
  }
  sprintf(local_358,"%d:%f",uVar17,(ulong)uVar12);
  sVar9 = strlen(local_358);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_358,sVar9);
  piVar15 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  if (piVar15 != piVar3) {
    pvVar1 = &ec->tag;
    do {
      iVar2 = *piVar15;
      p_Var4 = all->print_text;
      std::__cxx11::stringbuf::str();
      vVar5._end._0_4_ = (int)ec;
      vVar5._begin = (char *)in_stack_fffffffffffffc68;
      vVar5._end._4_4_ = (int)((ulong)ec >> 0x20);
      vVar5.end_array = (char *)all;
      vVar5.erase_count = (size_t)ld;
      (*p_Var4)(iVar2,(string)*pvVar1,vVar5);
      if (local_378 != local_368) {
        operator_delete(local_378);
      }
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar3);
  }
  bVar6 = (bool)(*(code *)PTR_test_label_002e0de0)(ld);
  print_update_cb_explore(all,bVar6,ec,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  return;
}

Assistant:

void output_example(vw& all, cb_explore& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;

  if ((c.known_cost = get_observed_cost(ld)) != nullptr)
    for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
      loss += get_unbiased_cost(c.known_cost, c.pred_scores, i+1) * ec.pred.a_s[i].score;

  all.sd->update(ec.test_only, get_observed_cost(ld) != nullptr, loss, 1.f, ec.num_features);

  char temp_str[20];
  stringstream ss, sso;
  float maxprob = 0.;
  uint32_t maxid = 0;
  for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
  {
    sprintf(temp_str, "%f ", ec.pred.a_s[i].score);
    ss << temp_str;
    if (ec.pred.a_s[i].score > maxprob)
    {
      maxprob = ec.pred.a_s[i].score;
      maxid = i + 1;
    }
  }

  sprintf(temp_str, "%d:%f", maxid, maxprob);
  sso << temp_str;

  for (int sink : all.final_prediction_sink) all.print_text(sink, ss.str(), ec.tag);

  print_update_cb_explore(all, CB::cb_label.test_label(&ld), ec, sso);
}